

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O3

void __thiscall bgui::BaseWindow::showBuffer(BaseWindow *this)

{
  int iVar1;
  int iVar2;
  pointer pbVar3;
  int iVar4;
  pointer pbVar5;
  XImage *pXVar6;
  GC p_Var7;
  int iVar8;
  Window WVar9;
  BaseWindowData *pBVar10;
  Display *pDVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  pBVar10 = this->p;
  if (pBVar10->running == true) {
    if ((pBVar10->text)._M_string_length == 0) {
      if ((pBVar10->info)._M_string_length == 0) {
        XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,0,0,0,0,pBVar10->w,
                  pBVar10->h);
      }
      else {
        uVar14 = XTextWidth(pBVar10->font,(pBVar10->info)._M_dataplus._M_p);
        pBVar10 = this->p;
        iVar17 = pBVar10->w;
        iVar2 = pBVar10->font->descent + pBVar10->font->ascent;
        iVar8 = (int)uVar14;
        if (pBVar10->top == true) {
          if (iVar17 - iVar8 != 0 && iVar8 <= iVar17) {
            if (pBVar10->left == true) {
              uVar12 = uVar14 & 0xffffffff;
            }
            else {
              uVar14 = 0;
              uVar12 = 0;
            }
            XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,uVar12,0,uVar14,0,
                      iVar17 - iVar8,iVar2);
          }
          pBVar10 = this->p;
          pDVar11 = pBVar10->display;
          WVar9 = pBVar10->window;
          p_Var7 = pBVar10->gc;
          pXVar6 = pBVar10->image;
          iVar17 = pBVar10->w;
          iVar8 = pBVar10->h - iVar2;
        }
        else {
          if (iVar17 - iVar8 != 0 && iVar8 <= iVar17) {
            iVar13 = pBVar10->h - iVar2;
            if (pBVar10->left == true) {
              uVar12 = uVar14 & 0xffffffff;
            }
            else {
              uVar12 = 0;
              uVar14 = 0;
            }
            XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,uVar12,iVar13,
                      uVar14,iVar13,iVar17 - iVar8,iVar2);
          }
          pBVar10 = this->p;
          pDVar11 = pBVar10->display;
          WVar9 = pBVar10->window;
          p_Var7 = pBVar10->gc;
          pXVar6 = pBVar10->image;
          iVar17 = pBVar10->w;
          iVar8 = pBVar10->h - iVar2;
          iVar2 = 0;
        }
        XPutImage(pDVar11,WVar9,p_Var7,pXVar6,0,iVar2,0,iVar2,iVar17,iVar8);
        anon_unknown_0::drawInfoText(this->p);
      }
    }
    else {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar17 = 0;
      gutil::split((vector *)&list,(string *)&pBVar10->text,'\n',false);
      pBVar10 = this->p;
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar8 = 0;
      }
      else {
        uVar14 = 0;
        lVar16 = 8;
        iVar8 = 0;
        iVar17 = 0;
        pbVar3 = list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (*(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar16) != 0) {
            iVar2 = XTextWidth(pBVar10->font,*(undefined8 *)((long)pbVar3 + lVar16 + -8));
            if (iVar17 <= iVar2) {
              iVar17 = iVar2;
            }
            pBVar10 = this->p;
            pbVar3 = list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar5 = list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          iVar8 = iVar8 + pBVar10->font->ascent + pBVar10->font->descent;
          uVar14 = uVar14 + 1;
          lVar16 = lVar16 + 0x20;
        } while (uVar14 < (ulong)((long)pbVar5 - (long)pbVar3 >> 5));
      }
      iVar2 = pBVar10->w;
      iVar13 = 0;
      iVar15 = 0;
      if (iVar2 - iVar17 != 0 && iVar17 <= iVar2) {
        iVar15 = (iVar2 - iVar17) / 2;
      }
      iVar1 = pBVar10->h;
      iVar4 = iVar1 - iVar8;
      if (((iVar4 != 0 && iVar8 <= iVar1) && (iVar13 = iVar4 / 2, 1 < iVar4)) &&
         (iVar4 = iVar13 + iVar8, iVar4 < iVar1)) {
        XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,0,0,0,0,iVar2,iVar13);
        pBVar10 = this->p;
        XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,0,iVar4,0,iVar4,
                  pBVar10->w,pBVar10->h - iVar4);
        pBVar10 = this->p;
      }
      if ((0 < iVar15) && (iVar17 = iVar17 + iVar15, iVar17 < pBVar10->w)) {
        XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,0,iVar13,0,iVar13,
                  iVar15,iVar8);
        pBVar10 = this->p;
        XPutImage(pBVar10->display,pBVar10->window,pBVar10->gc,pBVar10->image,iVar17,iVar13,iVar17,
                  iVar13,pBVar10->w - iVar17,iVar8);
        pBVar10 = this->p;
      }
      anon_unknown_0::drawInfoText(pBVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->p->mutex);
  return;
}

Assistant:

void BaseWindow::showBuffer()
{
  pthread_mutex_lock(&(p->mutex));

  if (p->running)
  {
    if (p->text.size() > 0)
    {
      // if text is displayed then draw whole image around text

      std::vector<std::string> list;
      gutil::split(list, p->text, '\n', false);

      int x=0, y=0;
      int w=0, h=0;

      for (size_t i=0; i<list.size(); i++)
      {
        if (list[i].size() > 0)
        {
          w=std::max(w, XTextWidth(p->font, list[i].c_str(), list[i].size()));
        }

        h+=p->font->ascent+p->font->descent;
      }

      if (p->w > w)
      {
        x+=(p->w-w)/2;
      }

      if (p->h > h)
      {
        y+=(p->h-h)/2;
      }

      if (y > 0 && p->h > y+h)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, y);
        XPutImage(p->display, p->window, p->gc, p->image, 0, y+h, 0, y+h, p->w, p->h-y-h);
      }

      if (x > 0 && p->w > x+w)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, y, 0, y, x, h);
        XPutImage(p->display, p->window, p->gc, p->image, x+w, y, x+w, y, p->w-x-w, h);
      }

      // draw text

      drawInfoText(p);
    }
    else if (p->info.size() > 0)
    {
      // if info line is displayed then draw whole image except line

      int w=XTextWidth(p->font, p->info.c_str(), p->info.size());
      int h=p->font->ascent+p->font->descent;

      if (p->top)
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, 0, w, 0, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, h, 0, h, p->w, p->h-h);
      }
      else
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, p->h-h, w, p->h-h, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, p->h-h, 0, p->h-h, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h-h);
      }

      // draw info line

      drawInfoText(p);
    }
    else
    {
      // draw whole image

      XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}